

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::apps::Recorder::getMessage(Recorder *this,size_t index)

{
  Message *pMVar1;
  Message *this_00;
  ulong in_RDX;
  
  if (in_RDX < (ulong)(*(long *)(index + 0x198) - *(long *)(index + 400) >> 3)) {
    pMVar1 = *(Message **)(*(long *)(index + 400) + in_RDX * 8);
    this_00 = (Message *)operator_new(0x100);
    Message::Message(this_00,pMVar1);
  }
  else {
    (this->super_App)._vptr_App = (_func_int **)0x0;
    this_00 = (Message *)0x0;
  }
  (this->super_App)._vptr_App = (_func_int **)this_00;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> Recorder::getMessage(std::size_t index) const
{
    if (isValidIndex(index, messages)) {
        return std::make_unique<Message>(*messages[index]);
    }
    return nullptr;
}